

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesize.cpp
# Opt level: O0

PageSizeId qt_idForPpdKey(QString *ppdKey,QSize *match)

{
  QLatin1StringView s;
  bool bVar1;
  char *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  int i;
  QStringView key;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  QLatin1StringView in_stack_ffffffffffffff98;
  char *pcVar4;
  PageSizeId local_34;
  undefined8 local_30;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x550c76);
  if (bVar1) {
    local_34 = Custom;
  }
  else {
    local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_18.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_ffffffffffffff98.m_data,
               (QString *)in_stack_ffffffffffffff98.m_size);
    QVar2 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_ffffffffffffff98.m_size,
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    pcVar4 = QVar2.m_data;
    QVar2.m_data = in_RSI;
    QVar2.m_size = (qsizetype)pcVar4;
    bVar1 = QStringView::endsWith
                      ((QStringView *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       QVar2,CaseInsensitive);
    if (bVar1) {
      QStringView::chop(&local_18,7);
    }
    else {
      in_stack_ffffffffffffff98 =
           Qt::Literals::StringLiterals::operator____L1
                     ((char *)in_stack_ffffffffffffff98.m_size,
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      s.m_data = in_RSI;
      s.m_size = (qsizetype)pcVar4;
      bVar1 = QStringView::endsWith
                        ((QStringView *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),s,
                         CaseInsensitive);
      if (bVar1) {
        QStringView::chop(&local_18,0xb);
      }
    }
    for (iVar3 = 0; iVar3 < 0x77; iVar3 = iVar3 + 1) {
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_ffffffffffffff98.m_data,
                 (char *)in_stack_ffffffffffffff98.m_size);
      bVar1 = operator==((QLatin1StringView *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                         (QStringView *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        if (in_RSI != (char *)0x0) {
          QSize::QSize((QSize *)CONCAT44(iVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
                       in_stack_ffffffffffffff88);
          *(undefined8 *)in_RSI = local_30;
        }
        local_34 = (PageSizeId)*(undefined8 *)(qt_pageSizes + iVar3) & 0xff;
        goto LAB_00550e26;
      }
    }
    local_34 = Custom;
  }
LAB_00550e26:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

static QPageSize::PageSizeId qt_idForPpdKey(const QString &ppdKey, QSize *match = nullptr)
{
    if (ppdKey.isEmpty())
        return QPageSize::Custom;
    QStringView key(ppdKey);
    // Remove any Rotated or Tranverse modifiers
    if (key.endsWith("Rotated"_L1))
        key.chop(7);
    else if (key.endsWith(".Transverse"_L1))
        key.chop(11);
    for (int i = 0; i <= int(QPageSize::LastPageSize); ++i) {
        if (QLatin1StringView(qt_pageSizes[i].mediaOption) == key) {
            if (match)
                *match = QSize(qt_pageSizes[i].widthPoints, qt_pageSizes[i].heightPoints);
            return qt_pageSizes[i].id;
        }
    }
    return QPageSize::Custom;
}